

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O0

double getdistortion(jas_matrix_t *orig,jas_matrix_t *recon,int depth,int metric)

{
  double dVar1;
  double local_28;
  double d;
  int metric_local;
  int depth_local;
  jas_matrix_t *recon_local;
  jas_matrix_t *orig_local;
  
  switch(metric) {
  case 1:
    dVar1 = pae(orig,recon);
    local_28 = (double)(dVar1 != 0.0);
    break;
  case 2:
  default:
    local_28 = psnr(orig,recon,depth);
    break;
  case 3:
    local_28 = msen(orig,recon,2);
    break;
  case 4:
    dVar1 = msen(orig,recon,2);
    local_28 = sqrt(dVar1);
    break;
  case 5:
    local_28 = pae(orig,recon);
    break;
  case 6:
    local_28 = msen(orig,recon,1);
  }
  return local_28;
}

Assistant:

double getdistortion(jas_matrix_t *orig, jas_matrix_t *recon, int depth, int metric)
{
	double d;

	switch (metric) {
	case metricid_psnr:
	default:
		d = psnr(orig, recon, depth);
		break;
	case metricid_mae:
		d = msen(orig, recon, 1);
		break;
	case metricid_mse:
		d = msen(orig, recon, 2);
		break;
	case metricid_rmse:
		d = sqrt(msen(orig, recon, 2));
		break;
	case metricid_pae:
		d = pae(orig, recon);
		break;
	case metricid_equal:
		d = (pae(orig, recon) == 0) ? 0 : 1;
		break;
	}
	return d;
}